

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qutil.cc
# Opt level: O2

void print_utf16(unsigned_long val)

{
  ostream *poVar1;
  unsigned_long in_RDX;
  size_type sVar2;
  int in_R8D;
  string local_70;
  string result;
  
  QUtil::toUTF16_abi_cxx11_(&result,(QUtil *)val,in_RDX);
  poVar1 = std::operator<<((ostream *)&std::cout,"0x");
  QUtil::uint_to_string_base_abi_cxx11_(&local_70,(QUtil *)val,0x10,0,in_R8D);
  poVar1 = std::operator<<(poVar1,(string *)&local_70);
  std::operator<<(poVar1," ->");
  std::__cxx11::string::~string((string *)&local_70);
  for (sVar2 = 0; result._M_string_length != sVar2; sVar2 = sVar2 + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout," ");
    QUtil::int_to_string_base_abi_cxx11_
              (&local_70,(QUtil *)(ulong)(byte)result._M_dataplus._M_p[sVar2],0x10,2,in_R8D);
    std::operator<<(poVar1,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__cxx11::string::~string((string *)&result);
  return;
}

Assistant:

static void
print_utf16(unsigned long val)
{
    std::string result = QUtil::toUTF16(val);
    std::cout << "0x" << QUtil::uint_to_string_base(val, 16) << " ->";
    for (auto const& ch: result) {
        std::cout << " "
                  << QUtil::int_to_string_base(
                         static_cast<int>(static_cast<unsigned char>(ch)), 16, 2);
    }
    std::cout << std::endl;
}